

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall Address_PegoutAddressTest_Test::TestBody(Address_PegoutAddressTest_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper local_338;
  Script pegout_script;
  Address addr2;
  Address addr1;
  
  std::__cxx11::string::string
            ((string *)&addr1,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,(allocator *)&addr2);
  cfd::core::Script::Script(&pegout_script,(string *)&addr1);
  std::__cxx11::string::~string((string *)&addr1);
  cfd::core::Address::GetPegoutAddress(&addr1,kCfdIllegalStateError,&pegout_script);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&addr2,&addr1);
  testing::internal::CmpHelperEQ<char[36],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo\"","addr1.GetAddress()",
             (char (*) [36])"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2);
  std::__cxx11::string::~string((string *)&addr2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&addr2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x404,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::core::Address::GetPegoutAddress
            (&addr2,kCfdSuccess,&pegout_script,
             (AddressFormatData *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar,&addr2);
  testing::internal::CmpHelperEQ<char[35],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"3GvkLLy7w52uaJrD3whPuFMxGDFZDDWg13\"","addr2.GetAddress()",
             (char (*) [35])"3GvkLLy7w52uaJrD3whPuFMxGDFZDDWg13",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x408,pcVar1);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Address::~Address(&addr1);
  cfd::core::Script::~Script(&pegout_script);
  return;
}

Assistant:

TEST(Address, PegoutAddressTest) {
  Script pegout_script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066");
  Address addr1 = Address::GetPegoutAddress(NetType::kRegtest, pegout_script);
  EXPECT_EQ("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo", addr1.GetAddress());

  Address addr2 = Address::GetPegoutAddress(NetType::kMainnet, pegout_script,
      GetBitcoinAddressFormatList()[0]);
  EXPECT_EQ("3GvkLLy7w52uaJrD3whPuFMxGDFZDDWg13", addr2.GetAddress());
}